

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::scrollTreeView(UEFITool *this,QListWidgetItem *item)

{
  QModelIndex *pQVar1;
  bool bVar2;
  long *plVar3;
  QFlags<QItemSelectionModel::SelectionFlag> local_70;
  Int local_6c;
  QModelIndex *local_68;
  QModelIndex *index;
  QVariant local_50;
  undefined1 local_30 [8];
  QByteArray second;
  QListWidgetItem *item_local;
  UEFITool *this_local;
  
  second.d.size = (qsizetype)item;
  (**(code **)(*(long *)item + 0x18))(&local_50,item,0x100);
  QVariant::toByteArray();
  QVariant::~QVariant(&local_50);
  local_68 = (QModelIndex *)QByteArray::data((QByteArray *)local_30);
  if ((local_68 != (QModelIndex *)0x0) && (bVar2 = QModelIndex::isValid(local_68), bVar2)) {
    (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),local_68,3);
    plVar3 = (long *)QAbstractItemView::selectionModel();
    pQVar1 = local_68;
    local_70 = operator|(Select,Rows);
    local_6c = (Int)QFlags<QItemSelectionModel::SelectionFlag>::operator|(&local_70,Clear);
    (**(code **)(*plVar3 + 0x68))(plVar3,pQVar1,local_6c);
  }
  QByteArray::~QByteArray((QByteArray *)local_30);
  return;
}

Assistant:

void UEFITool::scrollTreeView(QListWidgetItem* item)
{
    QByteArray second = item->data(Qt::UserRole).toByteArray();
    QModelIndex *index = (QModelIndex *)second.data();
    if (index && index->isValid()) {
        ui->structureTreeView->scrollTo(*index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(*index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}